

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_propagation.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_70cf1::ir_constant_propagation_visitor::visit_enter
          (ir_constant_propagation_visitor *this,ir_loop *ir)

{
  ir_loop *ir_local;
  ir_constant_propagation_visitor *this_local;
  
  handle_loop(this,ir,false);
  handle_loop(this,ir,true);
  return visit_continue_with_parent;
}

Assistant:

ir_visitor_status
ir_constant_propagation_visitor::visit_enter(ir_loop *ir)
{
   /* Make a conservative first pass over the loop with an empty ACP set.
    * This also removes any killed entries from the original ACP set.
    */
   handle_loop(ir, false);

   /* Then, run it again with the real ACP set, minus any killed entries.
    * This takes care of propagating values from before the loop into it.
    */
   handle_loop(ir, true);

   /* already descended into the children. */
   return visit_continue_with_parent;
}